

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<1,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float afStack_3c [9];
  int aiStack_18 [6];
  
  fVar2 = evalCtx->in[0].m_data[0];
  fVar3 = evalCtx->in[0].m_data[1];
  fVar4 = evalCtx->in[1].m_data[2];
  fVar5 = evalCtx->in[1].m_data[3];
  fVar6 = fVar2;
  fVar7 = fVar3;
  fVar8 = fVar4;
  fVar9 = fVar5;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar6 = -0.1;
    fVar7 = -0.2;
    fVar8 = 1.0;
    fVar9 = 0.0;
  }
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar2 = 0.8;
    fVar3 = 0.5;
    fVar4 = 0.1;
    fVar5 = -0.9;
  }
  afStack_3c[2] = fVar6 - fVar2;
  afStack_3c[3] = fVar8 - fVar4;
  afStack_3c[4] = (fVar7 - fVar3) + (fVar9 - fVar5);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_3c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}